

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::EnsureConsumeBranchIsland(IRBuilder *this)

{
  ByteCodeReader *this_00;
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  OpLayoutBr *pOVar8;
  Instr **ppIVar9;
  uint local_48;
  uint local_44;
  uint offset;
  uint targetOffset;
  uint local_38;
  LayoutSize local_34 [2];
  LayoutSize layoutSize;
  
  this_00 = &this->m_jnReader;
  OVar3 = Js::ByteCodeReader::PeekOp(this_00);
  if (OVar3 == Br) {
    uVar4 = Js::ByteCodeReader::GetCurrentOffset(this_00);
    local_48 = uVar4;
    OVar3 = Js::ByteCodeReader::ReadOp(this_00,local_34);
    if (OVar3 != Br) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1c13,"(opcode == Js::OpCode::Br)","opcode == Js::OpCode::Br");
      if (!bVar2) goto LAB_00499d87;
      *puVar7 = 0;
    }
    if (local_34[0] != SmallLayout) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1c14,"(layoutSize == Js::SmallLayout)","layoutSize == Js::SmallLayout");
      if (!bVar2) goto LAB_00499d87;
      *puVar7 = 0;
    }
    pOVar8 = Js::ByteCodeReader::Br(this_00);
    uVar5 = Js::ByteCodeReader::GetCurrentOffset(this_00);
    uVar5 = (int)pOVar8->RelativeJumpOffset + uVar5;
    local_44 = uVar5;
    uVar6 = Js::ByteCodeReader::GetCurrentOffset(this_00);
    if (uVar6 != uVar5) {
      offset = uVar5;
      targetOffset = uVar6;
      local_38 = uVar4;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      while (OVar3 = Js::ByteCodeReader::PeekOp(this_00), OVar3 == BrLong) {
        OVar3 = Js::ByteCodeReader::ReadOp(this_00,local_34);
        if (OVar3 != BrLong) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1c24,"(opcode == Js::OpCode::BrLong)","opcode == Js::OpCode::BrLong"
                            );
          if (!bVar2) goto LAB_00499d87;
          *puVar7 = 0;
        }
        if (local_34[0] != SmallLayout) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1c25,"(layoutSize == Js::SmallLayout)",
                             "layoutSize == Js::SmallLayout");
          if (!bVar2) goto LAB_00499d87;
          *puVar7 = 0;
        }
        Js::ByteCodeReader::BrLong(this_00);
      }
      uVar5 = Js::ByteCodeReader::GetCurrentOffset(this_00);
      uVar4 = local_38;
      if (uVar5 == offset) {
        Js::ByteCodeReader::SetCurrentOffset(this_00,targetOffset);
        ConsumeBranchIsland(this);
        uVar4 = local_38;
        if (this->longBranchMap == (LongBranchMap *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1c33,"(longBranchMap)","longBranchMap");
          if (!bVar2) goto LAB_00499d87;
          *puVar7 = 0;
        }
        if (this->m_offsetToInstructionCount <= uVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1c34,"(offset < m_offsetToInstructionCount)",
                             "offset < m_offsetToInstructionCount");
          if (!bVar2) goto LAB_00499d87;
          *puVar7 = 0;
        }
        ppIVar9 = this->m_offsetToInstruction;
        if (ppIVar9[uVar4] != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1c35,"(m_offsetToInstruction[offset] == nullptr)",
                             "m_offsetToInstruction[offset] == nullptr");
          if (!bVar2) {
LAB_00499d87:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar7 = 0;
          ppIVar9 = this->m_offsetToInstruction;
        }
        ppIVar9[uVar4] = (Instr *)0xffffffffffffffff;
        JsUtil::
        BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this->longBranchMap,&local_48,&local_44);
        return;
      }
    }
    Js::ByteCodeReader::SetCurrentOffset(this_00,uVar4);
  }
  return;
}

Assistant:

void
IRBuilder::EnsureConsumeBranchIsland()
{
    if (m_jnReader.PeekOp() == Js::OpCode::Br)
    {
        // Save the old offset
        uint offset = m_jnReader.GetCurrentOffset();

        // Read the potentially a branch around
        Js::LayoutSize layoutSize;
        Js::OpCode opcode = m_jnReader.ReadOp(layoutSize);
        Assert(opcode == Js::OpCode::Br);
        Assert(layoutSize == Js::SmallLayout);
        const unaligned Js::OpLayoutBr * playout = m_jnReader.Br();
        unsigned int      targetOffset = m_jnReader.GetCurrentOffset() + playout->RelativeJumpOffset;

        uint branchIslandOffset = m_jnReader.GetCurrentOffset();
        if (branchIslandOffset == targetOffset)
        {
            // branch to next, there is no long branch
            m_jnReader.SetCurrentOffset(offset);
            return;
        }

        // Ignore all the BrLong
        while (m_jnReader.PeekOp() == Js::OpCode::BrLong)
        {
            opcode = m_jnReader.ReadOp(layoutSize);
            Assert(opcode == Js::OpCode::BrLong);
            Assert(layoutSize == Js::SmallLayout);
            m_jnReader.BrLong();
        }

        // Confirm that is a branch around
        if ((uint)m_jnReader.GetCurrentOffset() == targetOffset)
        {
            // Really consume the branch island
            m_jnReader.SetCurrentOffset(branchIslandOffset);
            ConsumeBranchIsland();

            // Mark the virtual branch around as a redirect long branch as well
            // so that if it is the target of another branch, it will just keep pass
            // the branch island
            Assert(longBranchMap);
            Assert(offset < m_offsetToInstructionCount);
            Assert(m_offsetToInstruction[offset] == nullptr);
            m_offsetToInstruction[offset] = VirtualLongBranchInstr;
            longBranchMap->Add(offset, targetOffset);
        }
        else
        {
            // Reset the offset
            m_jnReader.SetCurrentOffset(offset);
        }
    }
}